

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace_printer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::NamespacePrinterTest_Basic_Test::
~NamespacePrinterTest_Basic_Test(NamespacePrinterTest_Basic_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_NamespacePrinterTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NamespacePrinterTest_018d2460;
  if ((this->super_NamespacePrinterTest).stream_.
      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged == true) {
    (this->super_NamespacePrinterTest).stream_.
    super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>._M_payload.
    super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged = false;
  }
  pcVar2 = (this->super_NamespacePrinterTest).out_._M_dataplus._M_p;
  paVar1 = &(this->super_NamespacePrinterTest).out_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(NamespacePrinterTest, Basic) {
  {
    io::Printer printer(output(), '$');

    const NamespacePrinter namespace_printer(&printer, {"A", "B", "E"});

    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "namespace A {\n"
            "namespace B {\n"
            "namespace E {\n"
            "\n"
            "}  // namespace E\n"
            "}  // namespace B\n"
            "}  // namespace A\n");
}